

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

void ImGui_ImplGlfw_KeyCallback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  ImGuiIO *pIVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [15];
  undefined1 auVar19 [16];
  
  if (g_PrevUserCallbackKey != (GLFWkeyfun)0x0) {
    (*g_PrevUserCallbackKey)(window,key,scancode,action,mods);
  }
  pIVar15 = ImGui::GetIO();
  if (action == 1) {
    bVar16 = true;
  }
  else {
    if (action != 0) goto LAB_001fabef;
    bVar16 = false;
  }
  pIVar15->KeysDown[key] = bVar16;
LAB_001fabef:
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(pIVar15->KeysDown + 0x154);
  auVar17 = psllw(auVar17,7);
  auVar17 = auVar17 & _DAT_002a4e10;
  auVar18[0] = -(auVar17[0] < '\0');
  auVar18[1] = -(auVar17[1] < '\0');
  auVar18[2] = -(auVar17[2] < '\0');
  auVar18[3] = -(auVar17[3] < '\0');
  auVar18[4] = -(auVar17[4] < '\0');
  auVar18[5] = -(auVar17[5] < '\0');
  auVar18[6] = -(auVar17[6] < '\0');
  auVar18[7] = -(auVar17[7] < '\0');
  auVar18[8] = -(auVar17[8] < '\0');
  auVar18[9] = -(auVar17[9] < '\0');
  auVar18[10] = -(auVar17[10] < '\0');
  auVar18[0xb] = -(auVar17[0xb] < '\0');
  auVar18[0xc] = -(auVar17[0xc] < '\0');
  auVar18[0xd] = -(auVar17[0xd] < '\0');
  auVar18[0xe] = -(auVar17[0xe] < '\0');
  auVar18 = auVar18 & DAT_002a4e20._0_15_ | ~auVar18 & ZEXT415(*(uint *)(pIVar15->KeysDown + 0x158))
  ;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar18._0_13_;
  auVar5[0xe] = auVar18[7];
  auVar6[0xc] = auVar18[6];
  auVar6._0_12_ = auVar18._0_12_;
  auVar6._13_2_ = auVar5._13_2_;
  auVar7[0xb] = 0;
  auVar7._0_11_ = auVar18._0_11_;
  auVar7._12_3_ = auVar6._12_3_;
  auVar8[10] = auVar18[5];
  auVar8._0_10_ = auVar18._0_10_;
  auVar8._11_4_ = auVar7._11_4_;
  auVar9[9] = 0;
  auVar9._0_9_ = auVar18._0_9_;
  auVar9._10_5_ = auVar8._10_5_;
  auVar10[8] = auVar18[4];
  auVar10._0_8_ = auVar18._0_8_;
  auVar10._9_6_ = auVar9._9_6_;
  auVar12._7_8_ = 0;
  auVar12._0_7_ = auVar10._8_7_;
  auVar13._1_8_ = SUB158(auVar12 << 0x40,7);
  auVar13[0] = auVar18[3];
  auVar13._9_6_ = 0;
  auVar14._1_10_ = SUB1510(auVar13 << 0x30,5);
  auVar14[0] = auVar18[2];
  auVar14._11_4_ = 0;
  auVar11[2] = auVar18[1];
  auVar11._0_2_ = auVar18._0_2_;
  auVar11._3_12_ = SUB1512(auVar14 << 0x20,3);
  auVar19._0_2_ = auVar18._0_2_ & 0xff;
  auVar19._2_13_ = auVar11._2_13_;
  auVar19[0xf] = 0;
  auVar17 = pshuflw(ZEXT416(*(uint *)(pIVar15->KeysDown + 0x158)),auVar19,0xe1);
  sVar1 = auVar17._0_2_;
  sVar2 = auVar17._2_2_;
  sVar3 = auVar17._4_2_;
  sVar4 = auVar17._6_2_;
  pIVar15->KeyCtrl = (bool)((0 < sVar1) * (sVar1 < 0x100) * auVar17[0] - (0xff < sVar1));
  pIVar15->KeyShift = (bool)((0 < sVar2) * (sVar2 < 0x100) * auVar17[2] - (0xff < sVar2));
  pIVar15->KeyAlt = (bool)((0 < sVar3) * (sVar3 < 0x100) * auVar17[4] - (0xff < sVar3));
  pIVar15->KeySuper = (bool)((0 < sVar4) * (sVar4 < 0x100) * auVar17[6] - (0xff < sVar4));
  return;
}

Assistant:

void ImGui_ImplGlfw_KeyCallback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (g_PrevUserCallbackKey != NULL)
        g_PrevUserCallbackKey(window, key, scancode, action, mods);

    ImGuiIO& io = ImGui::GetIO();
    if (action == GLFW_PRESS)
        io.KeysDown[key] = true;
    if (action == GLFW_RELEASE)
        io.KeysDown[key] = false;

    // Modifiers are not reliable across systems
    io.KeyCtrl = io.KeysDown[GLFW_KEY_LEFT_CONTROL] || io.KeysDown[GLFW_KEY_RIGHT_CONTROL];
    io.KeyShift = io.KeysDown[GLFW_KEY_LEFT_SHIFT] || io.KeysDown[GLFW_KEY_RIGHT_SHIFT];
    io.KeyAlt = io.KeysDown[GLFW_KEY_LEFT_ALT] || io.KeysDown[GLFW_KEY_RIGHT_ALT];
#ifdef _WIN32
    io.KeySuper = false;
#else
    io.KeySuper = io.KeysDown[GLFW_KEY_LEFT_SUPER] || io.KeysDown[GLFW_KEY_RIGHT_SUPER];
#endif
}